

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar3 = (ulong)(insn & 0x1f);
  uVar7 = insn >> 5 & 0x1f;
  uVar2 = MCInst_getOpcode(Inst);
  uVar8 = insn >> 10;
  uVar9 = uVar8 & 0x3f;
  if ((int)insn < 0) {
    uVar6 = 4;
    if (uVar3 != 0x1f) {
      uVar6 = GPR64DecoderTable[uVar3];
    }
    if (uVar2 == 0x5a) {
      uVar6 = GPR64DecoderTable[uVar3];
    }
    MCOperand_CreateReg0(Inst,uVar6);
    MCOperand_CreateReg0(Inst,GPR64DecoderTable[uVar7]);
    uVar2 = insn >> 0x10 & 0x40 | uVar9;
    iVar5 = 0x20;
    if (uVar2 != 0x3f) {
      uVar2 = uVar2 ^ 0x3f;
      iVar4 = 0x20;
      do {
        iVar5 = iVar4 + -1;
        if (iVar4 == 2) break;
        bVar1 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
        iVar4 = iVar5;
      } while (bVar1);
    }
    if (-1 < iVar5 + -0x20) {
      return MCDisassembler_Fail;
    }
    if ((uVar9 | -(0x80000000U >> ((byte)iVar5 & 0x1f))) == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    uVar8 = uVar8 & 0x1fff;
  }
  else {
    uVar6 = 5;
    if (uVar3 != 0x1f) {
      uVar6 = GPR32DecoderTable[uVar3];
    }
    if (uVar2 == 0x57) {
      uVar6 = GPR32DecoderTable[uVar3];
    }
    MCOperand_CreateReg0(Inst,uVar6);
    MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar7]);
    iVar5 = 0x20;
    if (uVar9 != 0x3f) {
      uVar3 = (ulong)(uVar9 ^ 0x3f);
      iVar4 = iVar5;
      do {
        iVar5 = iVar4 + -1;
        if (iVar4 == 2) break;
        uVar2 = (uint)uVar3;
        uVar3 = uVar3 >> 1;
        iVar4 = iVar5;
      } while (1 < uVar2);
    }
    if (-1 < iVar5 + -0x20) {
      return MCDisassembler_Fail;
    }
    if ((uVar9 | -(0x80000000U >> ((byte)iVar5 & 0x1f))) == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    uVar8 = uVar8 & 0xfff;
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar8);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeLogicalImmInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);
	unsigned imm;

	if (Datasize) {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSXri)
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 13);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 64))
			return Fail;
	} else {
		if (MCInst_getOpcode(Inst) == AArch64_ANDSWri)
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
		imm = fieldFromInstruction(insn, 10, 12);
		if (!AArch64_AM_isValidDecodeLogicalImmediate(imm, 32))
			return Fail;
	}

	MCOperand_CreateImm0(Inst, imm);
	return Success;
}